

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall chrono::robosimian::RoboSimian::SetCollide(RoboSimian *this,int flags)

{
  bool bVar1;
  element_type *this_00;
  element_type *this_01;
  reference psVar2;
  element_type *peVar3;
  undefined1 local_40 [8];
  shared_ptr<chrono::robosimian::RS_Limb> limb;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  *__range2;
  int flags_local;
  RoboSimian *this_local;
  
  this_00 = std::
            __shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_chassis);
  RS_Chassis::SetCollide(this_00,(flags & 1U) != 0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_sled);
  if (bVar1) {
    this_01 = std::
              __shared_ptr_access<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_sled);
    RS_Sled::SetCollide(this_01,(flags & 2U) != 0);
  }
  __end2 = std::
           vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
           ::begin(&this->m_limbs);
  limb.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
         ::end(&this->m_limbs);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<chrono::robosimian::RS_Limb>_*,_std::vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>_>
                                     *)&limb.
                                        super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), bVar1) {
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<chrono::robosimian::RS_Limb>_*,_std::vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>_>
             ::operator*(&__end2);
    std::shared_ptr<chrono::robosimian::RS_Limb>::shared_ptr
              ((shared_ptr<chrono::robosimian::RS_Limb> *)local_40,psVar2);
    peVar3 = std::
             __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    RS_Limb::SetCollideLinks(peVar3,SUB41((flags & 4U) >> 2,0));
    peVar3 = std::
             __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    RS_Limb::SetCollideWheel(peVar3,SUB41((flags & 8U) >> 3,0));
    std::shared_ptr<chrono::robosimian::RS_Limb>::~shared_ptr
              ((shared_ptr<chrono::robosimian::RS_Limb> *)local_40);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<chrono::robosimian::RS_Limb>_*,_std::vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void RoboSimian::SetCollide(int flags) {
    m_chassis->SetCollide((flags & static_cast<int>(CollisionFlags::CHASSIS)) != 0);

    if (m_sled)
        m_sled->SetCollide((flags & static_cast<int>(CollisionFlags::SLED)) != 0);

    for (auto limb : m_limbs) {
        limb->SetCollideLinks((flags & static_cast<int>(CollisionFlags::LIMBS)) != 0);
        limb->SetCollideWheel((flags & static_cast<int>(CollisionFlags::WHEELS)) != 0);
    }
}